

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_gfx_unload_mesh(rf_mesh mesh)

{
  rf_gfx_delete_buffers(*(uint *)mesh._96_8_);
  rf_gfx_delete_buffers(*(uint *)(mesh._96_8_ + 4));
  rf_gfx_delete_buffers(*(uint *)(mesh._96_8_ + 8));
  rf_gfx_delete_buffers(*(uint *)(mesh._96_8_ + 0xc));
  rf_gfx_delete_buffers(*(uint *)(mesh._96_8_ + 0x10));
  rf_gfx_delete_buffers(*(uint *)(mesh._96_8_ + 0x14));
  rf_gfx_delete_buffers(*(uint *)(mesh._96_8_ + 0x18));
  rf_gfx_delete_vertex_arrays((uint)mesh.bone_weights);
  return;
}

Assistant:

RF_API void rf_gfx_unload_mesh(rf_mesh mesh)
{
    rf_gfx_delete_buffers(mesh.vbo_id[0]);   // vertex
    rf_gfx_delete_buffers(mesh.vbo_id[1]);   // texcoords
    rf_gfx_delete_buffers(mesh.vbo_id[2]);   // normals
    rf_gfx_delete_buffers(mesh.vbo_id[3]);   // colors
    rf_gfx_delete_buffers(mesh.vbo_id[4]);   // tangents
    rf_gfx_delete_buffers(mesh.vbo_id[5]);   // texcoords2
    rf_gfx_delete_buffers(mesh.vbo_id[6]);   // indices

    rf_gfx_delete_vertex_arrays(mesh.vao_id);
}